

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float __x;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar5 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar1 = state->m_shaderParams->maxExpressionDepth;
    iVar2 = state->m_expressionDepth;
    iVar3 = getConservativeValueExprDepth(state,valueRange);
    fVar5 = 0.0;
    if (iVar3 + 1 <= iVar1 - iVar2) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar5 = 1.0;
      }
      else {
        fVar5 = 1.0;
        lVar4 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar8 = valueRange.m_min[lVar4].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar9 = 1.0;
          if (-INFINITY < fVar8) {
            __x = valueRange.m_max[lVar4].floatVal;
            fVar9 = 1.0;
            if (((__x < INFINITY) && (fVar9 = 0.0, fVar8 <= 1.0)) && (-1.0 <= __x)) {
              fVar9 = -12.566371;
              if (-1.0 <= fVar8) {
                fVar9 = asinf(fVar8);
                fVar9 = fVar9 * 8.0;
              }
              fVar6 = 1.5707964;
              if (__x <= 1.0) {
                fVar6 = asinf(__x);
              }
              fVar7 = ceilf(fVar9);
              fVar7 = fVar7 * 0.125;
              if (fVar7 <= fVar6) {
                fVar6 = floorf(fVar6 * 8.0);
                fVar9 = 0.0;
                if (fVar7 <= fVar6 * 0.125) {
                  if ((fVar8 != __x) || (fVar9 = 1.0, NAN(fVar8) || NAN(__x))) {
                    fVar9 = sinf(fVar6 * 0.125);
                    fVar6 = sinf(fVar7);
                    fVar8 = (fVar9 - fVar6) / (__x - fVar8);
                    fVar9 = 0.1;
                    if (0.1 <= fVar8) {
                      fVar9 = fVar8;
                    }
                  }
                }
              }
              else {
                fVar9 = 0.0;
              }
            }
          }
          fVar5 = fVar5 * fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar5;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}